

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::ParseWhitespace(Lexer *this)

{
  bool bVar1;
  Lexer *this_local;
  
  while ((bVar1 = IsEndOfText(this), ((bVar1 ^ 0xffU) & 1) != 0 &&
         (bVar1 = IsWhitespace(this,*this->m_current), bVar1))) {
    if (*this->m_current == '\t') {
      this->m_columnNumber = this->m_columnNumber + 3;
    }
    AdvanceCurrent(this);
  }
  this->m_columnMarker = this->m_columnNumber;
  return;
}

Assistant:

inline_t void Lexer::ParseWhitespace()
	{
		while (!IsEndOfText())
		{
			if (!IsWhitespace(*m_current))
				break;
			if (*m_current == '\t')
				m_columnNumber += (LogTabWidth - 1);
			AdvanceCurrent();
		}
		m_columnMarker = m_columnNumber;
	}